

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall AMPLSOption::AMPLSOption(AMPLSOption *this,char *name,char *descr,Option_Type type)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)this);
  std::__cxx11::string::assign((char *)&this->description);
  this->type = type;
  return;
}

Assistant:

AMPLSOption(const char* name, const char* descr, mp::SolverOption::Option_Type type) {
    this->name = name;
    this->description = descr;
    this->type = type;
  }